

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_util.cpp
# Opt level: O2

void spirv_cross_util::rename_interface_variable
               (Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
               uint32_t location,string *name)

{
  ID id;
  TypeID id_00;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  uint index;
  Resource *pRVar4;
  string *name_00;
  Resource *pRVar5;
  uint local_68;
  uint32_t location_local;
  Resource *local_60;
  string *local_58;
  string local_50;
  
  pRVar5 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
  pRVar4 = pRVar5 + (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  name_00 = name;
  location_local = location;
  local_60 = pRVar4;
  local_58 = name;
  for (; pRVar5 != pRVar4; pRVar5 = pRVar5 + 1) {
    bVar1 = spirv_cross::Compiler::has_decoration(compiler,(ID)(pRVar5->id).id,DecorationLocation);
    if ((bVar1) &&
       (uVar2 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)(pRVar5->id).id,DecorationLocation), uVar2 == location_local
       )) {
      pSVar3 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar5->base_type_id).id);
      if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
        id.id = (pRVar5->base_type_id).id;
        spirv_cross::join<char_const(&)[31],unsigned_int&>
                  (&local_50,(spirv_cross *)"SPIRV_Cross_Interface_Location",
                   (char (*) [31])&location_local,(uint *)name);
        spirv_cross::Compiler::set_name(compiler,id,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        index = 0;
        while (pRVar4 = local_60, name_00 = local_58, local_68 = index,
              index < (uint)(pSVar3->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                            buffer_size) {
          id_00.id = (pRVar5->base_type_id).id;
          spirv_cross::join<char_const(&)[16],unsigned_int&>
                    (&local_50,(spirv_cross *)"InterfaceMember",(char (*) [16])&local_68,
                     (uint *)name);
          name = &local_50;
          spirv_cross::Compiler::set_member_name(compiler,id_00,index,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          index = local_68 + 1;
        }
      }
      spirv_cross::Compiler::set_name(compiler,(ID)(pRVar5->id).id,name_00);
    }
  }
  return;
}

Assistant:

void rename_interface_variable(Compiler &compiler, const SmallVector<Resource> &resources, uint32_t location,
                               const std::string &name)
{
	for (auto &v : resources)
	{
		if (!compiler.has_decoration(v.id, spv::DecorationLocation))
			continue;

		auto loc = compiler.get_decoration(v.id, spv::DecorationLocation);
		if (loc != location)
			continue;

		auto &type = compiler.get_type(v.base_type_id);

		// This is more of a friendly variant. If we need to rename interface variables, we might have to rename
		// structs as well and make sure all the names match up.
		if (type.basetype == SPIRType::Struct)
		{
			compiler.set_name(v.base_type_id, join("SPIRV_Cross_Interface_Location", location));
			for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				compiler.set_member_name(v.base_type_id, i, join("InterfaceMember", i));
		}

		compiler.set_name(v.id, name);
	}
}